

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

int cmSourceFileGetPropertyAsBool(void *arg,char *prop)

{
  cmSourceFile *this;
  bool bVar1;
  char *val;
  allocator local_31;
  string local_30;
  
  this = *arg;
  if (this == (cmSourceFile *)0x0) {
    val = cmSourceFileGetProperty(arg,prop);
    bVar1 = cmSystemTools::IsOn(val);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,prop,&local_31);
    bVar1 = cmSourceFile::GetPropertyAsBool(this,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return (int)bVar1;
}

Assistant:

int CCONV cmSourceFileGetPropertyAsBool(void* arg, const char* prop)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if (cmSourceFile* rsf = sf->RealSourceFile) {
    return rsf->GetPropertyAsBool(prop) ? 1 : 0;
  }
  return cmSystemTools::IsOn(cmSourceFileGetProperty(arg, prop)) ? 1 : 0;
}